

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall immutable::vector<char,_true,_5>::vector(vector<char,_true,_5> *this)

{
  atomic<unsigned_int> *paVar1;
  rrb<char,_true,_5> *prVar2;
  leaf_node<char,_true> *__ptr;
  
  prVar2 = (rrb<char,_true,_5> *)malloc(0x28);
  prVar2->cnt = 0;
  prVar2->shift = 0;
  prVar2->tail_len = 0;
  __ptr = (leaf_node<char,_true> *)malloc(0x18);
  (prVar2->tail).ptr = (leaf_node<char,_true> *)0x0;
  (prVar2->root).ptr = (tree_node<char,_true> *)0x0;
  __ptr->type = LEAF_NODE;
  __ptr->len = 0;
  __ptr->child = (char *)0x0;
  __ptr->guid = 0;
  LOCK();
  (__ptr->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
  UNLOCK();
  LOCK();
  (__ptr->_ref_count).super___atomic_base<unsigned_int>._M_i =
       (__ptr->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
  UNLOCK();
  (prVar2->tail).ptr = __ptr;
  LOCK();
  paVar1 = &__ptr->_ref_count;
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
  UNLOCK();
  if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
    free(__ptr);
  }
  (this->_impl).ptr = prVar2;
  LOCK();
  (prVar2->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
  UNLOCK();
  return;
}

Assistant:

vector() = default;